

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkCommandBuffer vkCmdBuff,
          CommandPoolWrapper *CmdPool)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkCommandPool_T *pVVar2;
  VkResult VVar3;
  int iVar4;
  Uint64 UVar5;
  ICommandQueueVk *pIVar6;
  iterator iVar7;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  CommandPoolWrapper *Args_1;
  pthread_mutex_t *__mutex;
  char (*in_R8) [2];
  HardwareQueueIndex QueueFamilyIndex;
  string msg;
  string msg_4;
  key_type local_89;
  TransientCmdPoolRecycler local_88;
  string local_58;
  Uint64 local_38;
  
  Args_1 = CmdPool;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              ((string *)&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])CmdPool);
    Args_1 = (CommandPoolWrapper *)0x128;
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x128);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  VVar3 = (*vkEndCommandBuffer)(vkCmdBuff);
  if (VVar3 != VK_SUCCESS) {
    FormatString<char[29]>((string *)&local_88,(char (*) [29])"Failed to end command buffer");
    Args_1 = (CommandPoolWrapper *)0x12b;
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,299);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  if ((this->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CmdQueueCount <= (ulong)CommandQueueId.m_Value) {
    FormatString<char[26],char[27]>
              ((string *)&local_88,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x7fb2bd,
               (char (*) [27])Args_1);
    DebugAssertionFailed
              ((Char *)local_88.LogicalDevice,"LockCmdQueueAndRun",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x107);
    if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
      operator_delete(local_88.LogicalDevice,
                      (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                     super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                     )._M_weak_this.
                                     super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 1));
    }
  }
  __mutex = (pthread_mutex_t *)
            ((this->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).m_CommandQueues + CommandQueueId.m_Value);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    UVar5 = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x38))
                      (*(long **)((long)__mutex + 0x30),vkCmdBuff);
    pthread_mutex_unlock(__mutex);
    pIVar6 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ::GetCommandQueue(&this->
                                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                               ,CommandQueueId);
    iVar4 = (*(pIVar6->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar6);
    local_88.LogicalDevice = (VulkanLogicalDevice *)CONCAT44(local_88.LogicalDevice._4_4_,iVar4);
    local_89.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)&local_88);
    local_38 = UVar5;
    iVar7 = std::
            _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->m_TransientCmdPoolMgrs)._M_h,&local_89);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_58._M_dataplus._M_p._0_4_ = (uint)local_89.m_Value;
      FormatString<char[70],unsigned_int,char[2]>
                ((string *)&local_88,
                 (Diligent *)"Unable to find transient command pool manager for queue family index "
                 ,(char (*) [70])&local_58,(uint *)0x90e946,in_R8);
      DebugAssertionFailed
                ((Char *)local_88.LogicalDevice,"ExecuteAndDisposeTransientCmdBuff",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
                 ,0x185);
      if (local_88.LogicalDevice != (VulkanLogicalDevice *)&local_88.Pool) {
        operator_delete(local_88.LogicalDevice,
                        (ulong)((long)&((local_88.Pool.m_pLogicalDevice.
                                         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->
                                       super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>
                                       )._M_weak_this.
                                       super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 1));
      }
    }
    this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ::GetReleaseQueue(&this->
                                 super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                                ,CommandQueueId);
    UVar5 = local_38;
    local_88.LogicalDevice =
         (this->m_LogicalVkDevice).
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_88.CmdPoolMgr =
         (CommandPoolManager *)
         ((long)iVar7.
                super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                ._M_cur + 0x10);
    local_88.Pool.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (CmdPool->m_pLogicalDevice).
             super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_88.Pool.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (CmdPool->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (CmdPool->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (CmdPool->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_88.Pool.m_VkObject = CmdPool->m_VkObject;
    CmdPool->m_VkObject = (VkCommandPool_T *)0x0;
    local_88.vkCmdBuffer = vkCmdBuff;
    if (vkCmdBuff == (VkCommandBuffer)0x0 || local_88.Pool.m_VkObject == (VkCommandPool_T *)0x0) {
      FormatString<char[26],char[56]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE",
                 (char (*) [56])local_88.Pool.m_VkObject);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"TransientCmdPoolRecycler",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
                 ,0x15d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    local_58._M_dataplus._M_p = (pointer)operator_new(0x38);
    pVVar2 = local_88.Pool.m_VkObject;
    _Var1._M_pi = local_88.Pool.m_pLogicalDevice.
                  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    *(undefined ***)local_58._M_dataplus._M_p = &PTR__SpecificStaleResource_00aecc78;
    *(VulkanLogicalDevice **)((long)local_58._M_dataplus._M_p + 8) = local_88.LogicalDevice;
    *(CommandPoolManager **)((long)local_58._M_dataplus._M_p + 0x10) = local_88.CmdPoolMgr;
    local_88.Pool.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)((long)local_58._M_dataplus._M_p + 0x18) =
         local_88.Pool.m_pLogicalDevice.
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_dataplus._M_p + 0x20) =
         _Var1._M_pi;
    local_88.Pool.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_88.Pool.m_VkObject = (VkCommandPool_T *)0x0;
    *(VkCommandPool_T **)((long)local_58._M_dataplus._M_p + 0x28) = pVVar2;
    *(VkCommandBuffer *)((long)local_58._M_dataplus._M_p + 0x30) = local_88.vkCmdBuffer;
    local_88.CmdPoolMgr = (CommandPoolManager *)0x0;
    local_88.vkCmdBuffer = (VkCommandBuffer)0x0;
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardResource
              (this_00,(DynamicStaleResourceWrapper *)&local_58,UVar5);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 0x10))();
    }
    ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::~TransientCmdPoolRecycler
              (&local_88);
    return;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

void RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(SoftwareQueueIndex                    CommandQueueId,
                                                           VkCommandBuffer                       vkCmdBuff,
                                                           VulkanUtilities::CommandPoolWrapper&& CmdPool)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);

    VkResult err = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    // We MUST NOT discard stale objects when executing transient command buffer,
    // otherwise a resource can be destroyed while still being used by the GPU:
    //
    //
    // Next Cmd Buff| Next Fence |        Immediate Context               |            This thread               |
    //              |            |                                        |                                      |
    //      N       |     F      |                                        |                                      |
    //              |            |  Draw(ResourceX)                       |                                      |
    //      N  -  - | -   -   -  |  Release(ResourceX)                    |                                      |
    //              |            |  - {N, ResourceX} -> Stale Objects     |                                      |
    //              |            |                                        |                                      |
    //              |            |                                        | SubmitCommandBuffer()                |
    //              |            |                                        | - SubmittedCmdBuffNumber = N         |
    //              |            |                                        | - SubmittedFenceValue = F            |
    //     N+1      |    F+1     |                                        | - DiscardStaleVkObjects(N, F)        |
    //              |            |                                        |   - {F, ResourceX} -> Release Queue  |
    //              |            |                                        |                                      |
    //     N+2 -   -|  - F+2  -  |  ExecuteCommandBuffer()                |                                      |
    //              |            |  - SubmitCommandBuffer()               |                                      |
    //              |            |  - ResourceX is already in release     |                                      |
    //              |            |    queue with fence value F, and       |                                      |
    //              |            |    F < SubmittedFenceValue==F+1        |                                      |
    //
    // Since transient command buffers do not count as real command buffers, submit them directly to the queue
    // to avoid interference with the command buffer counter
    Uint64 FenceValue = 0;
    LockCmdQueueAndRun(CommandQueueId,
                       [&](ICommandQueueVk* pCmdQueueVk) //
                       {
                           FenceValue = pCmdQueueVk->SubmitCmdBuffer(vkCmdBuff);
                       } //
    );

    class TransientCmdPoolRecycler
    {
    public:
        TransientCmdPoolRecycler(const VulkanUtilities::VulkanLogicalDevice& _LogicalDevice,
                                 CommandPoolManager&                         _CmdPoolMgr,
                                 VulkanUtilities::CommandPoolWrapper&&       _Pool,
                                 VkCommandBuffer&&                           _vkCmdBuffer) :
            // clang-format off
            LogicalDevice{_LogicalDevice         },
            CmdPoolMgr   {&_CmdPoolMgr           },
            Pool         {std::move(_Pool)       },
            vkCmdBuffer  {std::move(_vkCmdBuffer)}
        // clang-format on
        {
            VERIFY_EXPR(Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE);
            _vkCmdBuffer = VK_NULL_HANDLE;
        }

        // clang-format off
        TransientCmdPoolRecycler             (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (      TransientCmdPoolRecycler&&) = delete;

        TransientCmdPoolRecycler(TransientCmdPoolRecycler&& rhs) noexcept :
            LogicalDevice{rhs.LogicalDevice         },
            CmdPoolMgr   {rhs.CmdPoolMgr            },
            Pool         {std::move(rhs.Pool)       },
            vkCmdBuffer  {std::move(rhs.vkCmdBuffer)}
        {
            rhs.CmdPoolMgr  = nullptr;
            rhs.vkCmdBuffer = VK_NULL_HANDLE;
        }
        // clang-format on

        ~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }

    private:
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice;

        CommandPoolManager*                 CmdPoolMgr = nullptr;
        VulkanUtilities::CommandPoolWrapper Pool;
        VkCommandBuffer                     vkCmdBuffer = VK_NULL_HANDLE;
    };

    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Unable to find transient command pool manager for queue family index ", Uint32{QueueFamilyIndex}, ".");

    // Discard command pool directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue
    // clang-format off
    GetReleaseQueue(CommandQueueId).DiscardResource(
        TransientCmdPoolRecycler
        {
            GetLogicalDevice(),
            CmdPoolMgrIter->second,
            std::move(CmdPool),
            std::move(vkCmdBuff)
        },
        FenceValue);
    // clang-format on
}